

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O3

void Sfm_PrintCnf(Vec_Str_t *vCnf)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  
  if (0 < vCnf->nSize) {
    lVar3 = 0;
    do {
      bVar1 = vCnf->pArray[lVar3];
      if (bVar1 == 0xff) {
        putchar(10);
      }
      else {
        if ((char)bVar1 < '\0') {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10d,"int Abc_LitIsCompl(int)");
        }
        pcVar2 = "-";
        if ((bVar1 & 1) == 0) {
          pcVar2 = "";
        }
        printf("%s%d ",pcVar2,(ulong)(bVar1 >> 1));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCnf->nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_PrintCnf( Vec_Str_t * vCnf )
{
    char Entry;
    int i, Lit;
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        Lit = (int)Entry;
        if ( Lit == -1 )
            printf( "\n" );
        else
            printf( "%s%d ", Abc_LitIsCompl(Lit) ? "-":"", Abc_Lit2Var(Lit) );
    }
}